

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_lib.c
# Opt level: O0

BIO * BIO_new_ex(OSSL_LIB_CTX *libctx,BIO_METHOD *method)

{
  int iVar1;
  BIO *func;
  CRYPTO_RWLOCK *pCVar2;
  BIO_METHOD *in_RSI;
  OSSL_LIB_CTX *in_RDI;
  BIO *bio;
  undefined8 in_stack_ffffffffffffffe0;
  
  func = (BIO *)CRYPTO_zalloc((size_t)in_RDI,(char *)in_RSI,
                              (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (func == (BIO *)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_RDI,(int)((ulong)in_RSI >> 0x20),(char *)func);
    ERR_set_error(0x20,0xc0100,(char *)0x0);
  }
  else {
    func->libctx = in_RDI;
    func->method = in_RSI;
    func->shutdown = 1;
    LOCK();
    func->references = 1;
    UNLOCK();
    iVar1 = CRYPTO_new_ex_data(0xc,func,(CRYPTO_EX_DATA *)&func->ex_data);
    if (iVar1 != 0) {
      pCVar2 = CRYPTO_THREAD_lock_new();
      func->lock = pCVar2;
      if (func->lock == (CRYPTO_RWLOCK *)0x0) {
        ERR_new();
        ERR_set_debug((char *)in_RDI,(int)((ulong)in_RSI >> 0x20),(char *)func);
        ERR_set_error(0x20,0xc0100,(char *)0x0);
        CRYPTO_free_ex_data(0xc,func,(CRYPTO_EX_DATA *)&func->ex_data);
      }
      else {
        if ((in_RSI->create == (_func_int_BIO_ptr *)0x0) ||
           (iVar1 = (*in_RSI->create)(func), iVar1 != 0)) {
          if (in_RSI->create != (_func_int_BIO_ptr *)0x0) {
            return func;
          }
          func->init = 1;
          return func;
        }
        ERR_new();
        ERR_set_debug((char *)in_RDI,(int)((ulong)in_RSI >> 0x20),(char *)func);
        ERR_set_error(0x20,0xc0105,(char *)0x0);
        CRYPTO_free_ex_data(0xc,func,(CRYPTO_EX_DATA *)&func->ex_data);
        CRYPTO_THREAD_lock_free((CRYPTO_RWLOCK *)0x21a5c5);
      }
    }
    CRYPTO_free(func);
  }
  return (BIO *)0x0;
}

Assistant:

BIO *BIO_new_ex(OSSL_LIB_CTX *libctx, const BIO_METHOD *method)
{
    BIO *bio = OPENSSL_zalloc(sizeof(*bio));

    if (bio == NULL) {
        ERR_raise(ERR_LIB_BIO, ERR_R_MALLOC_FAILURE);
        return NULL;
    }

    bio->libctx = libctx;
    bio->method = method;
    bio->shutdown = 1;
    bio->references = 1;

    if (!CRYPTO_new_ex_data(CRYPTO_EX_INDEX_BIO, bio, &bio->ex_data))
        goto err;

    bio->lock = CRYPTO_THREAD_lock_new();
    if (bio->lock == NULL) {
        ERR_raise(ERR_LIB_BIO, ERR_R_MALLOC_FAILURE);
        CRYPTO_free_ex_data(CRYPTO_EX_INDEX_BIO, bio, &bio->ex_data);
        goto err;
    }

    if (method->create != NULL && !method->create(bio)) {
        ERR_raise(ERR_LIB_BIO, ERR_R_INIT_FAIL);
        CRYPTO_free_ex_data(CRYPTO_EX_INDEX_BIO, bio, &bio->ex_data);
        CRYPTO_THREAD_lock_free(bio->lock);
        goto err;
    }
    if (method->create == NULL)
        bio->init = 1;

    return bio;

err:
    OPENSSL_free(bio);
    return NULL;
}